

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t exr_add_part(exr_context_t ctxt,char *partname,exr_storage_t type,int *new_index)

{
  exr_result_t eVar1;
  char *d;
  uint8_t **in_RCX;
  exr_attribute_type_t in_EDX;
  char *in_RSI;
  _internal_exr_context *in_RDI;
  exr_attribute_t **in_stack_00000010;
  size_t pnamelen;
  _internal_exr_context *pctxt;
  _internal_exr_part *part;
  char *typestr;
  int32_t attrsz;
  exr_result_t rv;
  int32_t in_stack_ffffffffffffffa4;
  exr_attr_string_t *in_stack_ffffffffffffffb0;
  _internal_exr_context *ctxt_00;
  _internal_exr_context *f;
  char *ctxt_01;
  int local_2c;
  int32_t in_stack_ffffffffffffffe0;
  _internal_exr_context *list;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  f = (_internal_exr_context *)0x0;
  ctxt_00 = (_internal_exr_context *)0x0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_2c = 2;
  }
  else {
    list = in_RDI;
    internal_exr_lock(in_RDI);
    if (in_RDI->mode == '\x01') {
      local_2c = internal_exr_add_part(f,(_internal_exr_part **)ctxt_00,(int *)in_RDI);
      if (local_2c == 0) {
        ctxt_00->has_nonimage_data = (char)in_EDX;
        ctxt_00->is_multipart = (char)(in_EDX >> 8);
        ctxt_00->strict_header = (char)(in_EDX >> 0x10);
        ctxt_00->silent_header = (char)(in_EDX >> 0x18);
        d = (char *)(ulong)in_EDX;
        switch(d) {
        case (char *)0x0:
          ctxt_01 = "scanlineimage";
          break;
        case (char *)0x1:
          ctxt_01 = "tiledimage";
          break;
        case (char *)0x2:
          ctxt_01 = "deepscanline";
          break;
        case (char *)0x3:
          ctxt_01 = "deeptile";
          break;
        case (char *)0x4:
        default:
          internal_exr_revert_add_part
                    (ctxt_00,(_internal_exr_part **)in_RDI,&in_stack_ffffffffffffffb0->length);
          internal_exr_unlock(in_RDI);
          eVar1 = (*in_RDI->print_error)
                            (in_RDI,3,"Invalid storage type %d for new part",(ulong)in_EDX);
          return eVar1;
        }
        local_2c = exr_attr_list_add_static_name
                             ((exr_context_t)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (exr_attribute_list_t *)list,in_RSI,in_EDX,in_stack_ffffffffffffffe0,
                              in_RCX,in_stack_00000010);
        if (local_2c == 0) {
          local_2c = exr_attr_string_init_static_with_length
                               ((exr_context_t)ctxt_01,(exr_attr_string_t *)ctxt_00,(char *)in_RDI,
                                (int32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          if (local_2c == 0) {
            if (in_RSI == (char *)0x0) {
              in_RSI = "";
            }
            if ((in_RSI != (char *)0x0) && (*in_RSI != '\0')) {
              in_stack_ffffffffffffffb0 = (exr_attr_string_t *)strlen(in_RSI);
              if ((exr_attr_string_t *)0x7ffffffe < in_stack_ffffffffffffffb0) {
                internal_exr_revert_add_part
                          (ctxt_00,(_internal_exr_part **)in_RDI,(int *)in_stack_ffffffffffffffb0);
                internal_exr_unlock(in_RDI);
                eVar1 = (*in_RDI->print_error)
                                  (in_RDI,0xe,"Part name \'%s\': Invalid name length %lu",in_RSI,
                                   in_stack_ffffffffffffffb0);
                return eVar1;
              }
              local_2c = exr_attr_list_add_static_name
                                   ((exr_context_t)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (exr_attribute_list_t *)list,in_RSI,in_EDX,
                                    in_stack_ffffffffffffffe0,in_RCX,in_stack_00000010);
              if (local_2c == 0) {
                local_2c = exr_attr_string_create_with_length
                                     ((exr_context_t)in_RDI,in_stack_ffffffffffffffb0,d,
                                      in_stack_ffffffffffffffa4);
              }
            }
            if ((local_2c == 0) && ((in_EDX == EXR_ATTR_CHLIST || (in_EDX == EXR_ATTR_BOX2F)))) {
              local_2c = exr_attr_list_add_static_name
                                   ((exr_context_t)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (exr_attribute_list_t *)list,in_RSI,in_EDX,
                                    in_stack_ffffffffffffffe0,in_RCX,in_stack_00000010);
              if (local_2c == 0) {
                *(undefined4 *)(*(long *)&ctxt_00->default_zip_level + 0x18) = 1;
              }
              in_RDI->has_nonimage_data = '\x01';
            }
            if (local_2c == 0) {
              if (1 < in_RDI->num_parts) {
                in_RDI->is_multipart = '\x01';
              }
              if (((in_RDI->has_nonimage_data == '\0') && (in_RDI->num_parts == 1)) &&
                 (in_EDX == EXR_ATTR_BOX2I)) {
                in_RDI->is_singlepart_tiled = '\x01';
              }
              else {
                in_RDI->is_singlepart_tiled = '\0';
              }
            }
            else {
              internal_exr_revert_add_part
                        (ctxt_00,(_internal_exr_part **)in_RDI,&in_stack_ffffffffffffffb0->length);
            }
            internal_exr_unlock(in_RDI);
          }
          else {
            internal_exr_revert_add_part
                      (ctxt_00,(_internal_exr_part **)in_RDI,&in_stack_ffffffffffffffb0->length);
            internal_exr_unlock(in_RDI);
          }
        }
        else {
          internal_exr_revert_add_part
                    (ctxt_00,(_internal_exr_part **)in_RDI,&in_stack_ffffffffffffffb0->length);
          internal_exr_unlock(in_RDI);
        }
      }
      else {
        internal_exr_unlock(in_RDI);
      }
    }
    else {
      internal_exr_unlock(in_RDI);
      local_2c = (*in_RDI->standard_error)(in_RDI,8);
    }
  }
  return local_2c;
}

Assistant:

exr_result_t
exr_add_part (
    exr_context_t ctxt,
    const char*   partname,
    exr_storage_t type,
    int*          new_index)
{
    exr_result_t rv;
    int32_t      attrsz  = -1;
    const char*  typestr = NULL;

    struct _internal_exr_part* part = NULL;

    EXR_PROMOTE_LOCKED_CONTEXT_OR_ERROR (ctxt);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    rv = internal_exr_add_part (pctxt, &part, new_index);
    if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

    part->storage_mode = type;
    switch (type)
    {
        case EXR_STORAGE_SCANLINE:
            typestr = "scanlineimage";
            attrsz  = 13;
            break;
        case EXR_STORAGE_TILED:
            typestr = "tiledimage";
            attrsz  = 10;
            break;
        case EXR_STORAGE_DEEP_SCANLINE:
            typestr = "deepscanline";
            attrsz  = 12;
            break;
        case EXR_STORAGE_DEEP_TILED:
            typestr = "deeptile";
            attrsz  = 8;
            break;
        case EXR_STORAGE_LAST_TYPE:
        default:
            internal_exr_revert_add_part (pctxt, &part, new_index);
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid storage type %d for new part",
                (int) type));
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(part->attributes),
        EXR_REQ_TYPE_STR,
        EXR_ATTR_STRING,
        0,
        NULL,
        &(part->type));

    if (rv != EXR_ERR_SUCCESS)
    {
        internal_exr_revert_add_part (pctxt, &part, new_index);
        return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
    }

    rv = exr_attr_string_init_static_with_length (
        ctxt, part->type->string, typestr, attrsz);

    if (rv != EXR_ERR_SUCCESS)
    {
        internal_exr_revert_add_part (pctxt, &part, new_index);
        return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
    }

    /* make sure we put in SOME sort of partname */
    if (!partname) partname = "";
    if (partname && partname[0] != '\0')
    {
        size_t pnamelen = strlen (partname);
        if (pnamelen >= INT32_MAX)
        {
            internal_exr_revert_add_part (pctxt, &part, new_index);
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ATTR,
                "Part name '%s': Invalid name length %" PRIu64,
                partname,
                (uint64_t) pnamelen));
        }

        rv = exr_attr_list_add_static_name (
            ctxt,
            &(part->attributes),
            EXR_REQ_NAME_STR,
            EXR_ATTR_STRING,
            0,
            NULL,
            &(part->name));

        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_create_with_length (
                ctxt, part->name->string, partname, (int32_t) pnamelen);
    }

    if (rv == EXR_ERR_SUCCESS &&
        (type == EXR_STORAGE_DEEP_TILED || type == EXR_STORAGE_DEEP_SCANLINE))
    {
        rv = exr_attr_list_add_static_name (
            ctxt,
            &(part->attributes),
            EXR_REQ_VERSION_STR,
            EXR_ATTR_INT,
            0,
            NULL,
            &(part->version));
        if (rv == EXR_ERR_SUCCESS) part->version->i = 1;
        pctxt->has_nonimage_data = 1;
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        if (pctxt->num_parts > 1) pctxt->is_multipart = 1;

        if (!pctxt->has_nonimage_data && pctxt->num_parts == 1 &&
            type == EXR_STORAGE_TILED)
            pctxt->is_singlepart_tiled = 1;
        else
            pctxt->is_singlepart_tiled = 0;
    }
    else
        internal_exr_revert_add_part (pctxt, &part, new_index);

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}